

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAligned
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  void *pvVar1;
  SerialArena *this_00;
  long *in_FS_OFFSET;
  bool bVar2;
  
  if (((byte)this[8] & 2) == 0) {
    pvVar1 = (void *)*in_FS_OFFSET;
    if (*(long *)((long)pvVar1 + 8) == *(long *)this) {
      this_00 = *(SerialArena **)((long)pvVar1 + 0x10);
      bVar2 = true;
    }
    else {
      this_00 = *(SerialArena **)(this + 0x18);
      if (this_00 == (SerialArena *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = this_00->owner_ == pvVar1;
      }
    }
    if (bVar2) {
      pvVar1 = SerialArena::AllocateAligned
                         (this_00,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8))
      ;
      return pvVar1;
    }
  }
  pvVar1 = AllocateAlignedFallback(this,n,type);
  return pvVar1;
}

Assistant:

void* AllocateAligned(size_t n, const std::type_info* type) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                              GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, AllocPolicy());
    } else {
      return AllocateAlignedFallback(n, type);
    }
  }